

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O0

void __thiscall
json11::Value<(json11::Json::Type)1,_double>::dump
          (Value<(json11::Json::Type)1,_double> *this,string *out)

{
  string *out_local;
  Value<(json11::Json::Type)1,_double> *this_local;
  
  json11::dump(this->m_value,out);
  return;
}

Assistant:

void dump(string &out) const override { json11::dump(m_value, out); }